

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_call_on_invalid_frame_recv_callback
              (nghttp2_session *session,nghttp2_frame *frame,int lib_error_code)

{
  nghttp2_on_invalid_frame_recv_callback p_Var1;
  int iVar2;
  
  p_Var1 = (session->callbacks).on_invalid_frame_recv_callback;
  if (p_Var1 != (nghttp2_on_invalid_frame_recv_callback)0x0) {
    iVar2 = (*p_Var1)(session,frame,-0x1f9,session->user_data);
    if (iVar2 != 0) {
      return -0x386;
    }
  }
  return 0;
}

Assistant:

static int session_call_on_invalid_frame_recv_callback(nghttp2_session *session,
                                                       nghttp2_frame *frame,
                                                       int lib_error_code) {
  if (session->callbacks.on_invalid_frame_recv_callback) {
    if (session->callbacks.on_invalid_frame_recv_callback(
            session, frame, lib_error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}